

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

void player_quests_reset(player *p)

{
  quest *pqVar1;
  char *pcVar2;
  ulong local_18;
  size_t i;
  player *p_local;
  
  if (p->quests != (quest *)0x0) {
    player_quests_free(p);
  }
  pqVar1 = (quest *)mem_zalloc((ulong)z_info->quest_max * 0x30);
  p->quests = pqVar1;
  for (local_18 = 0; local_18 < z_info->quest_max; local_18 = local_18 + 1) {
    pcVar2 = string_make(quests[local_18].name);
    p->quests[local_18].name = pcVar2;
    p->quests[local_18].level = quests[local_18].level;
    p->quests[local_18].race = quests[local_18].race;
    p->quests[local_18].max_num = quests[local_18].max_num;
  }
  return;
}

Assistant:

void player_quests_reset(struct player *p)
{
	size_t i;

	if (p->quests)
		player_quests_free(p);
	p->quests = mem_zalloc(z_info->quest_max * sizeof(struct quest));

	for (i = 0; i < z_info->quest_max; i++) {
		p->quests[i].name = string_make(quests[i].name);
		p->quests[i].level = quests[i].level;
		p->quests[i].race = quests[i].race;
		p->quests[i].max_num = quests[i].max_num;
	}
}